

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xrespondent.c
# Opt level: O0

void nn_xrespondent_rm(nn_sockbase *self,nn_pipe *pipe)

{
  void *ptr;
  nn_sockbase *local_30;
  nn_xrespondent_data *data;
  nn_xrespondent *xrespondent;
  nn_pipe *pipe_local;
  nn_sockbase *self_local;
  
  local_30 = self;
  if (self == (nn_sockbase *)0x0) {
    local_30 = (nn_sockbase *)0x0;
  }
  ptr = nn_pipe_getdata(pipe);
  nn_fq_rm((nn_fq *)&local_30[2].sock,(nn_fq_data *)((long)ptr + 0x20));
  nn_hash_erase((nn_hash *)&local_30[1].sock,(nn_hash_item *)((long)ptr + 8));
  nn_hash_item_term((nn_hash_item *)((long)ptr + 8));
  nn_free(ptr);
  return;
}

Assistant:

void nn_xrespondent_rm (struct nn_sockbase *self, struct nn_pipe *pipe)
{
    struct nn_xrespondent *xrespondent;
    struct nn_xrespondent_data *data;

    xrespondent = nn_cont (self, struct nn_xrespondent, sockbase);
    data = nn_pipe_getdata (pipe);

    nn_fq_rm (&xrespondent->inpipes, &data->initem);
    nn_hash_erase (&xrespondent->outpipes, &data->outitem);
    nn_hash_item_term (&data->outitem);

    nn_free (data);
}